

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbounds.hpp
# Opt level: O0

void __thiscall soplex::SPxSolverBase<double>::setLeaveBounds(SPxSolverBase<double> *this)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  DataKey *pDVar4;
  undefined8 in_RDI;
  SPxSolverBase<double> *unaff_retaddr;
  int in_stack_00000018;
  int in_stack_0000001c;
  SPxSolverBase<double> *in_stack_00000020;
  SPxId base_id;
  int i;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  SPxColId local_24;
  SPxRowId local_1c;
  DataKey local_14;
  int local_c;
  
  local_c = 0;
  while( true ) {
    iVar1 = local_c;
    iVar3 = dim((SPxSolverBase<double> *)0x25c96d);
    if (iVar3 <= iVar1) break;
    pDVar4 = &SPxBasisBase<double>::baseId
                        ((SPxBasisBase<double> *)
                         CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                         in_stack_ffffffffffffffbc)->super_DataKey;
    local_14 = *pDVar4;
    bVar2 = SPxId::isSPxRowId((SPxId *)&local_14);
    if (bVar2) {
      SPxRowId::SPxRowId(&local_1c,(SPxId *)&local_14);
      SPxLPBase<double>::number
                ((SPxLPBase<double> *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 (SPxRowId *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      setLeaveBound4Row(in_stack_00000020,in_stack_0000001c,in_stack_00000018);
    }
    else {
      in_stack_ffffffffffffffc4 = local_c;
      SPxColId::SPxColId(&local_24,(SPxId *)&local_14);
      SPxLPBase<double>::number
                ((SPxLPBase<double> *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 (SPxColId *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      setLeaveBound4Col(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
    }
    local_c = local_c + 1;
  }
  return;
}

Assistant:

void SPxSolverBase<R>::setLeaveBounds()
{

   for(int i = 0; i < dim(); ++i)
   {
      SPxId base_id = this->baseId(i);

      if(base_id.isSPxRowId())
         setLeaveBound4Row(i, this->number(SPxRowId(base_id)));
      else
         setLeaveBound4Col(i, this->number(SPxColId(base_id)));
   }
}